

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener.cxx
# Opt level: O2

void __thiscall
WienerCpp::WienerCpp
          (WienerCpp *this,Time *time,double w,double n,double lambda,double n_rc,double lambda_rc)

{
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  local_38 = w;
  local_30 = lambda;
  local_28 = n;
  local_20 = n_rc;
  local_18 = lambda_rc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Wiener Process",&local_7a)
  ;
  Wiener::Wiener(&this->super_Wiener,time,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  *(undefined ***)&this->super_Wiener = &PTR__WienerCpp_00157920;
  *(undefined ***)&(this->super_Wiener).field_0x60 = &PTR__WienerCpp_001579e0;
  *(undefined ***)&(this->super_Wiener).field_0x78 = &PTR__WienerCpp_00157a28;
  this->condW = local_38;
  this->condLambda = local_30;
  this->condN = local_28;
  this->condCoincWidth = local_20;
  this->condCoincRate = local_18;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"number-of-processes",(allocator<char> *)&local_58);
  Parametric::addParameter((Parametric *)this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"single-weight",(allocator<char> *)&local_58);
  Parametric::addParameter((Parametric *)this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"single-rate",(allocator<char> *)&local_58);
  Parametric::addParameter((Parametric *)this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"coincidence-width",(allocator<char> *)&local_58);
  Parametric::addParameter((Parametric *)this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"coincidence-rate",(allocator<char> *)&local_58);
  Parametric::addParameter((Parametric *)this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  (**(code **)(*(long *)&this->super_Wiener + 0x68))(this);
  return;
}

Assistant:

WienerCpp::WienerCpp( Time *time, double w, double n, double lambda, double n_rc, double lambda_rc ) : Wiener( time ) 
{
	condW = w;
	condLambda = lambda;
	condN = n;
	condCoincWidth = n_rc;
	condCoincRate = lambda_rc;
	addParameter("number-of-processes");
	addParameter("single-weight");
	addParameter("single-rate");
	addParameter("coincidence-width");
	addParameter("coincidence-rate");
	init();
}